

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_base.cpp
# Opt level: O2

void duckdb::ToBaseFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  UnifiedVectorFormat *pUVar1;
  long lVar2;
  anon_union_16_2_67f50693_for_value *paVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  UnifiedVectorFormat *pUVar7;
  UnifiedVectorFormat *pUVar8;
  undefined8 *puVar9;
  UnifiedVectorFormat *pUVar10;
  ValidityMask *in_R8;
  idx_t in_R9;
  UnifiedVectorFormat *pUVar11;
  string_t sVar12;
  anon_struct_16_3_d7536bce_for_pointer aVar13;
  long *local_108;
  long local_100;
  long local_f8;
  UnifiedVectorFormat bdata;
  long local_b8;
  long local_b0;
  UnifiedVectorFormat adata;
  long local_70;
  long local_68;
  
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  pvVar6 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,2);
  pUVar1 = *(UnifiedVectorFormat **)(args + 0x18);
  if (((*pvVar4 == (value_type)0x2) && (*pvVar5 == (value_type)0x2)) && (*pvVar6 == (value_type)0x2)
     ) {
    duckdb::Vector::SetVectorType((VectorType)result);
    if ((((*(byte **)(pvVar4 + 0x28) != (byte *)0x0) && ((**(byte **)(pvVar4 + 0x28) & 1) == 0)) ||
        ((*(byte **)(pvVar5 + 0x28) != (byte *)0x0 && ((**(byte **)(pvVar5 + 0x28) & 1) == 0)))) ||
       ((*(byte **)(pvVar6 + 0x28) != (byte *)0x0 && ((**(byte **)(pvVar6 + 0x28) & 1) == 0)))) {
      duckdb::ConstantVector::SetNull(result,true);
      return;
    }
    paVar3 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
    aVar13 = (anon_struct_16_3_d7536bce_for_pointer)
             TernaryLambdaWrapper::
             Operation<duckdb::ToBaseFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,long,int,int,duckdb::string_t>
                       ((anon_class_8_1_6971b95b)result,**(long **)(pvVar4 + 0x20),
                        **(int **)(pvVar5 + 0x20),
                        *(int *)&((*(ValidityMask **)(pvVar6 + 0x20))->
                                 super_TemplatedValidityMask<unsigned_long>).validity_mask,
                        *(ValidityMask **)(pvVar6 + 0x20),in_R9);
    paVar3->pointer = aVar13;
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&adata);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&bdata);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_108);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar4,pUVar1);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar5,pUVar1);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar6,pUVar1);
    lVar2 = *(long *)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    if (((local_68 == 0) && (local_b0 == 0)) && (local_f8 == 0)) {
      puVar9 = (undefined8 *)(lVar2 + 8);
      for (pUVar11 = (UnifiedVectorFormat *)0x0; pUVar1 != pUVar11; pUVar11 = pUVar11 + 1) {
        pUVar7 = pUVar11;
        if (*_adata != 0) {
          pUVar7 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_adata + (long)pUVar11 * 4);
        }
        pUVar8 = pUVar11;
        if (*_bdata != 0) {
          pUVar8 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_bdata + (long)pUVar11 * 4);
        }
        pUVar10 = pUVar11;
        if (*local_108 != 0) {
          pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_108 + (long)pUVar11 * 4);
        }
        sVar12 = TernaryLambdaWrapper::
                 Operation<duckdb::ToBaseFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,long,int,int,duckdb::string_t>
                           ((anon_class_8_1_6971b95b)result,*(long *)(local_70 + (long)pUVar7 * 8),
                            *(int *)(local_b8 + (long)pUVar8 * 4),
                            *(int *)(local_100 + (long)pUVar10 * 4),in_R8,in_R9);
        puVar9[-1] = sVar12.value._0_8_;
        *puVar9 = sVar12.value._8_8_;
        puVar9 = puVar9 + 2;
      }
    }
    else {
      puVar9 = (undefined8 *)(lVar2 + 8);
      for (pUVar11 = (UnifiedVectorFormat *)0x0; pUVar1 != pUVar11; pUVar11 = pUVar11 + 1) {
        pUVar7 = pUVar11;
        if (*_adata != 0) {
          pUVar7 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_adata + (long)pUVar11 * 4);
        }
        pUVar8 = pUVar11;
        if (*_bdata != 0) {
          pUVar8 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_bdata + (long)pUVar11 * 4);
        }
        pUVar10 = pUVar11;
        if (*local_108 != 0) {
          pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_108 + (long)pUVar11 * 4);
        }
        if (((local_68 == 0) ||
            ((*(ulong *)(local_68 + ((ulong)pUVar7 >> 6) * 8) >> ((ulong)pUVar7 & 0x3f) & 1) != 0))
           && (((local_b0 == 0 ||
                ((*(ulong *)(local_b0 + ((ulong)pUVar8 >> 6) * 8) >> ((ulong)pUVar8 & 0x3f) & 1) !=
                 0)) && ((local_f8 == 0 ||
                         ((*(ulong *)(local_f8 + ((ulong)pUVar10 >> 6) * 8) >>
                           ((ulong)pUVar10 & 0x3f) & 1) != 0)))))) {
          sVar12 = TernaryLambdaWrapper::
                   Operation<duckdb::ToBaseFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,long,int,int,duckdb::string_t>
                             ((anon_class_8_1_6971b95b)result,*(long *)(local_70 + (long)pUVar7 * 8)
                              ,*(int *)(local_b8 + (long)pUVar8 * 4),
                              *(int *)(local_100 + (long)pUVar10 * 4),in_R8,in_R9);
          puVar9[-1] = sVar12.value._0_8_;
          *puVar9 = sVar12.value._8_8_;
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),(idx_t)pUVar11);
        }
        puVar9 = puVar9 + 2;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_108);
    UnifiedVectorFormat::~UnifiedVectorFormat(&bdata);
    UnifiedVectorFormat::~UnifiedVectorFormat(&adata);
  }
  return;
}

Assistant:

static void ToBaseFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &input = args.data[0];
	auto &radix = args.data[1];
	auto &min_length = args.data[2];
	auto count = args.size();

	TernaryExecutor::Execute<int64_t, int32_t, int32_t, string_t>(
	    input, radix, min_length, result, count, [&](int64_t input, int32_t radix, int32_t min_length) {
		    if (input < 0) {
			    throw InvalidInputException("'to_base' number must be greater than or equal to 0");
		    }
		    if (radix < 2 || radix > 36) {
			    throw InvalidInputException("'to_base' radix must be between 2 and 36");
		    }
		    if (min_length > 64 || min_length < 0) {
			    throw InvalidInputException("'to_base' min_length must be between 0 and 64");
		    }

		    char buf[64];
		    char *end = buf + sizeof(buf);
		    char *ptr = end;
		    do {
			    *--ptr = alphabet[input % radix];
			    input /= radix;
		    } while (input > 0);

		    auto length = end - ptr;
		    while (length < min_length) {
			    *--ptr = '0';
			    length++;
		    }

		    return StringVector::AddString(result, ptr, UnsafeNumericCast<idx_t>(end - ptr));
	    });
}